

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::ParseArrayMid
          (Status *__return_storage_ptr__,JsonStreamParser *this,TokenType type)

{
  StringPiece local_48;
  StringPiece local_38;
  ParseType local_24;
  
  if (type == END_ARRAY) {
    (*this->ow_->_vptr_ObjectWriter[5])();
    Advance(this);
  }
  else {
    if (type != VALUE_SEPARATOR) {
      if (type == UNKNOWN) {
        StringPiece::StringPiece(&local_48,"Expected , or ] after array value.");
        ReportUnknown(__return_storage_ptr__,this,local_48);
        return __return_storage_ptr__;
      }
      StringPiece::StringPiece(&local_38,"Expected , or ] after array value.");
      ReportFailure(__return_storage_ptr__,this,local_38);
      return __return_storage_ptr__;
    }
    Advance(this);
    local_24 = ARRAY_VALUE;
    std::
    deque<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
    ::emplace_back<google::protobuf::util::converter::JsonStreamParser::ParseType>
              (&(this->stack_).c,&local_24);
  }
  Status::Status(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::ParseArrayMid(TokenType type) {
  if (type == UNKNOWN) {
    return ReportUnknown("Expected , or ] after array value.");
  }

  if (type == END_ARRAY) {
    ow_->EndList();
    Advance();
    return util::Status();
  }

  // Found a comma, advance past it and expect an array value next.
  if (type == VALUE_SEPARATOR) {
    Advance();
    stack_.push(ARRAY_VALUE);
    return util::Status();
  }
  // Illegal token after array value.
  return ReportFailure("Expected , or ] after array value.");
}